

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_error_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v;
  JSValue val;
  JSValue val_00;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  int iVar1;
  BOOL BVar2;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSValue JVar3;
  JSValue JVar4;
  JSAtom in_stack_0000001c;
  JSContext *in_stack_00000020;
  undefined1 in_stack_00000028 [16];
  JSValue in_stack_00000038;
  JSValue msg;
  JSValue name;
  JSAtom in_stack_fffffffffffffecc;
  JSContext *in_stack_fffffffffffffed0;
  JSValueUnion in_stack_fffffffffffffed8;
  JSValueUnion in_stack_fffffffffffffee0;
  int64_t in_stack_fffffffffffffee8;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  JSValue in_stack_ffffffffffffff18;
  JSValue in_stack_ffffffffffffff28;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined1 local_70 [16];
  undefined8 local_38;
  
  JVar3.tag = in_RDX;
  JVar3.u.float64 = in_RSI.float64;
  iVar1 = JS_IsObject(JVar3);
  if (iVar1 == 0) {
    local_70 = (undefined1  [16])JS_ThrowTypeErrorNotAnObject((JSContext *)0x1a7d55);
  }
  else {
    JVar3 = JS_GetPropertyInternal
                      (in_stack_00000020,in_stack_00000038,in_stack_0000001c,
                       (JSValue)in_stack_00000028,(BOOL)this_val.tag);
    iVar1 = JS_IsUndefined(JVar3);
    if (iVar1 == 0) {
      val.tag = in_stack_fffffffffffffee8;
      val.u.float64 = in_stack_fffffffffffffee0.float64;
      in_stack_ffffffffffffff18 = JS_ToStringFree((JSContext *)in_stack_fffffffffffffed8.ptr,val);
      local_a8 = in_stack_ffffffffffffff18.u;
      local_a0 = in_stack_ffffffffffffff18.tag;
    }
    else {
      in_stack_ffffffffffffff28 =
           JS_AtomToString(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
      local_a8 = in_stack_ffffffffffffff28.u;
      local_a0 = in_stack_ffffffffffffff28.tag;
    }
    v_02.tag = local_a0;
    v_02.u.ptr = local_a8;
    iVar1 = JS_IsException(v_02);
    if (iVar1 == 0) {
      JVar3 = JS_GetPropertyInternal
                        (in_stack_00000020,in_stack_00000038,in_stack_0000001c,
                         (JSValue)in_stack_00000028,(BOOL)this_val.tag);
      local_38 = (JSContext *)JVar3.tag;
      iVar1 = JS_IsUndefined(JVar3);
      if (iVar1 == 0) {
        val_00.tag = in_stack_fffffffffffffee8;
        val_00.u.ptr = in_stack_fffffffffffffee0.ptr;
        JVar3 = JS_ToStringFree((JSContext *)in_stack_fffffffffffffed8.ptr,val_00);
        local_b8 = JVar3.u;
        local_110 = JVar3.tag;
        local_b0 = local_110;
      }
      else {
        JVar3 = JS_AtomToString(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
        local_108 = JVar3.u;
        local_b8 = local_108;
        local_100 = JVar3.tag;
        local_b0 = local_100;
      }
      v_00.tag = local_b0;
      v_00.u.ptr = local_b8;
      iVar1 = JS_IsException(v_00);
      if (iVar1 == 0) {
        v_03.tag = local_a0;
        v_03.u.ptr = local_a8;
        BVar2 = JS_IsEmptyString(v_03);
        if (BVar2 == 0) {
          v_01.tag = local_b0;
          v_01.u.ptr = local_b8;
          BVar2 = JS_IsEmptyString(v_01);
          if (BVar2 == 0) {
            JS_ConcatString3((JSContext *)in_stack_ffffffffffffff18.tag,
                             (char *)in_stack_ffffffffffffff18.u.ptr,in_stack_ffffffffffffff28,
                             (char *)local_38);
          }
        }
        local_70 = (undefined1  [16])
                   JS_ConcatString(local_38,in_stack_ffffffffffffff28,in_stack_ffffffffffffff18);
      }
      else {
        v.tag = (int64_t)in_stack_fffffffffffffee0.ptr;
        v.u.ptr = in_stack_fffffffffffffed8.ptr;
        JS_FreeValue(in_stack_fffffffffffffed0,v);
        local_70._0_8_ = local_70._4_8_ << 0x20;
        local_70._8_8_ = 6;
      }
    }
    else {
      local_70._0_8_ = local_70._4_8_ << 0x20;
      local_70._8_8_ = 6;
    }
  }
  JVar4.u = (JSValueUnion)local_70._0_8_;
  JVar4.tag = local_70._8_8_;
  return JVar4;
}

Assistant:

static JSValue js_error_toString(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    JSValue name, msg;

    if (!JS_IsObject(this_val))
        return JS_ThrowTypeErrorNotAnObject(ctx);
    name = JS_GetProperty(ctx, this_val, JS_ATOM_name);
    if (JS_IsUndefined(name))
        name = JS_AtomToString(ctx, JS_ATOM_Error);
    else
        name = JS_ToStringFree(ctx, name);
    if (JS_IsException(name))
        return JS_EXCEPTION;

    msg = JS_GetProperty(ctx, this_val, JS_ATOM_message);
    if (JS_IsUndefined(msg))
        msg = JS_AtomToString(ctx, JS_ATOM_empty_string);
    else
        msg = JS_ToStringFree(ctx, msg);
    if (JS_IsException(msg)) {
        JS_FreeValue(ctx, name);
        return JS_EXCEPTION;
    }
    if (!JS_IsEmptyString(name) && !JS_IsEmptyString(msg))
        name = JS_ConcatString3(ctx, "", name, ": ");
    return JS_ConcatString(ctx, name, msg);
}